

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 14.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  char *pcVar2;
  char w;
  char eme [8];
  char local_11;
  char local_10 [8];
  
  builtin_strncpy(local_10,"\x1b[1;37m",8);
  std::operator<<((ostream *)&std::cout,local_10);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Voce acredita que o humano nasce da alteridade(s/n)?");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,&local_11);
  if (local_11 == 'n') {
    std::operator<<((ostream *)&std::cout,"Voce precisa estudar o grande filosofo judeu lituano\n");
    poVar1 = std::operator<<((ostream *)&std::cout,"Emanuel Levinas!");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    if (local_11 == 's') {
      std::operator<<((ostream *)&std::cout,anon_var_dwarf_873);
      std::operator<<((ostream *)&std::cout,
                      "o comeco do filosofar, o fundamento da razao, o sentido\n");
      pcVar2 = anon_var_dwarf_89f;
    }
    else {
      pcVar2 = "Opcao invalida.Tente outra vez\n";
    }
    std::operator<<((ostream *)&std::cout,pcVar2);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    char eme[] = {0x1b, '[', '1', ';', '3', '7', 'm', 0};
    cout << eme;
    const char s = 's';
    const char n = 'n';
    char w;

    cout << "Voce acredita que o humano nasce da alteridade(s/n)?" << endl;
    cin >> w;

    if (w == s)
    {
        cout << "SIM!Para o grande filósofo Emanuel Levinas, a ALTERIDADE,\n";
        cout << "o comeco do filosofar, o fundamento da razao, o sentido\n";
        cout << "do humano eh a possibilidade de realização da justica e paz!!\n";
    }
    else if (w == n)
    {
        cout << "Voce precisa estudar o grande filosofo judeu lituano\n";
        cout << "Emanuel Levinas!" << endl;
    }
    else
    {
        cout << "Opcao invalida.Tente outra vez\n";
    }

    return 0;
}